

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZDisassembler.c
# Opt level: O0

DecodeStatus
decodeBDLAddr64Disp12Len8Operand(MCInst *Inst,uint64_t Field,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  void *Decoder_local;
  uint64_t Address_local;
  uint64_t Field_local;
  MCInst *Inst_local;
  
  DVar1 = decodeBDLAddr12Len8Operand(Inst,Field,SystemZMC_GR64Regs);
  return DVar1;
}

Assistant:

static DecodeStatus decodeBDLAddr64Disp12Len8Operand(MCInst *Inst, uint64_t Field,
		uint64_t Address, const void *Decoder)
{
	return decodeBDLAddr12Len8Operand(Inst, Field, SystemZMC_GR64Regs);
}